

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O0

void __thiscall MipTimer::reportMipLevel1Clock(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  initializer_list<int> __l;
  double in_RDI;
  HighsInt unaff_retaddr;
  HighsTimerClock *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  char *in_stack_00000018;
  MipTimer *in_stack_00000020;
  vector<int,_std::allocator<int>_> mip_clock_list;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  allocator_type *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  iterator piVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *this_00;
  
  __x = (vector<int,_std::allocator<int>_> *)0x900000008;
  this_00 = (vector<int,_std::allocator<int>_> *)0x30000000a;
  piVar1 = (iterator)0x500000004;
  sVar2 = 0x700000006;
  std::allocator<int>::allocator((allocator<int> *)0x61122d);
  __l._M_len = sVar2;
  __l._M_array = piVar1;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffa0,__l,in_stack_ffffffffffffff98);
  std::allocator<int>::~allocator((allocator<int> *)0x611252);
  std::vector<int,_std::allocator<int>_>::vector(this_00,__x);
  reportMipClockList(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                     unaff_retaddr,in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff80);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void reportMipLevel1Clock(const HighsTimerClock& mip_timer_clock) {
    const std::vector<HighsInt> mip_clock_list{kMipClockInit,
                                               kMipClockRunPresolve,
                                               kMipClockRunSetup,
                                               kMipClockTrivialHeuristics,
                                               kMipClockEvaluateRootNode,
                                               kMipClockPerformAging0,
                                               kMipClockSearch,
                                               kMipClockPostsolve};
    reportMipClockList("MipLevl1", mip_clock_list, mip_timer_clock,
                       kMipClockTotal, tolerance_percent_report);
  }